

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::GLSL420Pack::Utils::getBlockVariableReference_abi_cxx11_
          (string *__return_storage_ptr__,Utils *this,VARIABLE_FLAVOUR flavour,GLchar *variable_name
          ,GLchar *block_name)

{
  undefined4 in_register_00000014;
  size_t local_38;
  size_t position;
  GLchar *local_28;
  GLchar *block_name_local;
  GLchar *variable_name_local;
  string *psStack_10;
  VARIABLE_FLAVOUR flavour_local;
  string *variable_definition;
  
  block_name_local = (GLchar *)CONCAT44(in_register_00000014,flavour);
  variable_name_local._4_4_ = (int)this;
  position._7_1_ = 0;
  local_28 = variable_name;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_38 = 0;
  if (variable_name_local._4_4_ == 0) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getBlockVariableReference::ref_template);
  }
  else if (variable_name_local._4_4_ == 1) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getBlockVariableReference::array_ref_template);
  }
  else if (variable_name_local._4_4_ == 2) {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getBlockVariableReference::tcs_ref_template);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,getBlockVariableReference::ref_template);
  }
  replaceAllTokens(getBlockVariableReference::token_block_name,local_28,__return_storage_ptr__);
  replaceToken(getBlockVariableReference::token_variable_name,&local_38,block_name_local,
               __return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string Utils::getBlockVariableReference(VARIABLE_FLAVOUR flavour, const glw::GLchar* variable_name,
											 const glw::GLchar* block_name)
{
	/* Templates */
	static const GLchar* ref_template		= "BLOCK_NAME.VARIABLE_NAME";
	static const GLchar* array_ref_template = "BLOCK_NAME[0].VARIABLE_NAME";
	static const GLchar* tcs_ref_template   = "BLOCK_NAME[gl_InvocationID].VARIABLE_NAME";

	/* Token */
	static const GLchar* token_block_name	= "BLOCK_NAME";
	static const GLchar* token_variable_name = "VARIABLE_NAME";

	/* Variables */
	std::string variable_definition;
	size_t		position = 0;

	/* Select variable reference template */
	switch (flavour)
	{
	case BASIC:
		variable_definition = ref_template;
		break;
	case ARRAY:
		variable_definition = array_ref_template;
		break;
	case INDEXED_BY_INVOCATION_ID:
		variable_definition = tcs_ref_template;
		break;
	default:
		variable_definition = ref_template;
		break;
	}

	/* Replace tokens */
	replaceAllTokens(token_block_name, block_name, variable_definition);
	replaceToken(token_variable_name, position, variable_name, variable_definition);

	/* Done */
	return variable_definition;
}